

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O2

void uv__signal_handler(int signum)

{
  int iVar1;
  uv_signal_s *puVar2;
  int iVar3;
  int *piVar4;
  uv_signal_s *puVar5;
  ssize_t sVar6;
  uv_signal_s *puVar7;
  uv_signal_t *puVar8;
  bool bVar9;
  uv_signal_t *local_40;
  undefined8 local_38;
  
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  local_38 = 0;
  iVar3 = uv__signal_lock();
  if (iVar3 == 0) {
    puVar5 = uv__signal_first_handle(signum);
    do {
      puVar8 = puVar5;
      if ((puVar8 == (uv_signal_t *)0x0) || (puVar8->signum != signum)) goto LAB_00553bc5;
      local_38 = CONCAT44(local_38._4_4_,signum);
      local_40 = puVar8;
      do {
        sVar6 = write(puVar8->loop->signal_pipefd[1],&local_40,0x10);
        if ((int)sVar6 != -1) {
          if ((int)sVar6 != 0x10) goto LAB_00553bdc;
          puVar8->caught_signals = puVar8->caught_signals + 1;
          goto LAB_00553b78;
        }
      } while (*piVar4 == 4);
      if (*piVar4 != 0xb) {
LAB_00553bdc:
        __assert_fail("r == sizeof msg || (r == -1 && (errno == EAGAIN || errno == EWOULDBLOCK))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/signal.c"
                      ,0xd5,"void uv__signal_handler(int)");
      }
LAB_00553b78:
      puVar7 = (puVar8->tree_entry).rbe_right;
      if (puVar7 == (uv_signal_s *)0x0) {
        puVar5 = (puVar8->tree_entry).rbe_parent;
        if ((puVar5 == (uv_signal_s *)0x0) || ((puVar5->tree_entry).rbe_left != puVar8)) {
          do {
            puVar5 = (puVar8->tree_entry).rbe_parent;
            if (puVar5 == (uv_signal_s *)0x0) {
              puVar5 = (uv_signal_t *)0x0;
              break;
            }
            bVar9 = puVar8 == (puVar5->tree_entry).rbe_right;
            puVar8 = puVar5;
          } while (bVar9);
        }
      }
      else {
        do {
          puVar2 = (puVar7->tree_entry).rbe_left;
          puVar5 = puVar7;
          puVar7 = puVar2;
        } while (puVar2 != (uv_signal_s *)0x0);
      }
    } while( true );
  }
LAB_00553bca:
  *piVar4 = iVar1;
  return;
LAB_00553bc5:
  uv__signal_unlock();
  goto LAB_00553bca;
}

Assistant:

static void uv__signal_handler(int signum) {
  uv__signal_msg_t msg;
  uv_signal_t* handle;
  int saved_errno;

  saved_errno = errno;
  memset(&msg, 0, sizeof msg);

  if (uv__signal_lock()) {
    errno = saved_errno;
    return;
  }

  for (handle = uv__signal_first_handle(signum);
       handle != NULL && handle->signum == signum;
       handle = RB_NEXT(uv__signal_tree_s, &uv__signal_tree, handle)) {
    int r;

    msg.signum = signum;
    msg.handle = handle;

    /* write() should be atomic for small data chunks, so the entire message
     * should be written at once. In theory the pipe could become full, in
     * which case the user is out of luck.
     */
    do {
      r = write(handle->loop->signal_pipefd[1], &msg, sizeof msg);
    } while (r == -1 && errno == EINTR);

    assert(r == sizeof msg ||
           (r == -1 && (errno == EAGAIN || errno == EWOULDBLOCK)));

    if (r != -1)
      handle->caught_signals++;
  }

  uv__signal_unlock();
  errno = saved_errno;
}